

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Module.cpp
# Opt level: O1

Module * remote::GetModuleHandle(Module *__return_storage_ptr__,Handle proc,string *filename)

{
  pointer pcVar1;
  _Alloc_hider _Var2;
  int iVar3;
  ostream *poVar4;
  pointer pRVar5;
  vector<remote::Region,_std::allocator<remote::Region>_> regs;
  Region reg;
  vector<remote::Region,_std::allocator<remote::Region>_> processRegions;
  Handle local_fc;
  vector<remote::Region,_std::allocator<remote::Region>_> local_f8;
  undefined1 local_d8 [56];
  _Alloc_hider local_a0;
  char local_90 [16];
  _Alloc_hider local_80;
  char local_70 [16];
  vector<remote::Region,_std::allocator<remote::Region>_> local_60;
  vector<remote::Region,_std::allocator<remote::Region>_> local_48;
  
  local_fc.pid = proc.pid;
  Handle::GetRegions(&local_48,&local_fc);
  if (local_48.super__Vector_base<remote::Region,_std::allocator<remote::Region>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_48.super__Vector_base<remote::Region,_std::allocator<remote::Region>_>._M_impl.
      super__Vector_impl_data._M_start) {
    (__return_storage_ptr__->symbols).
    super__Vector_base<remote::ModuleSymbol,_std::allocator<remote::ModuleSymbol>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->symbols).
    super__Vector_base<remote::ModuleSymbol,_std::allocator<remote::ModuleSymbol>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->regions).
    super__Vector_base<remote::Region,_std::allocator<remote::Region>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->symbols).
    super__Vector_base<remote::ModuleSymbol,_std::allocator<remote::ModuleSymbol>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->regions).
    super__Vector_base<remote::Region,_std::allocator<remote::Region>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->regions).
    super__Vector_base<remote::Region,_std::allocator<remote::Region>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    std::vector<remote::Region,_std::allocator<remote::Region>_>::_M_erase_at_end
              (&__return_storage_ptr__->regions,(pointer)0x0);
  }
  else {
    local_f8.super__Vector_base<remote::Region,_std::allocator<remote::Region>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_f8.super__Vector_base<remote::Region,_std::allocator<remote::Region>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_f8.super__Vector_base<remote::Region,_std::allocator<remote::Region>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pRVar5 = local_48.super__Vector_base<remote::Region,_std::allocator<remote::Region>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      local_d8._48_8_ = pRVar5->inodeFileNumber;
      local_d8._0_8_ = pRVar5->start;
      local_d8._8_4_ = (undefined4)pRVar5->end;
      local_d8._12_4_ = *(undefined4 *)((long)&pRVar5->end + 4);
      local_d8[0x10] = pRVar5->read;
      local_d8[0x11] = pRVar5->write;
      local_d8[0x12] = pRVar5->exec;
      local_d8[0x13] = pRVar5->shared;
      local_d8._20_4_ = *(undefined4 *)&pRVar5->field_0x14;
      local_d8._24_4_ = (undefined4)pRVar5->offset;
      local_d8._28_4_ = *(undefined4 *)((long)&pRVar5->offset + 4);
      local_d8._32_4_ = (undefined4)pRVar5->deviceMajor;
      local_d8._36_4_ = *(undefined4 *)((long)&pRVar5->deviceMajor + 4);
      local_d8._40_4_ = (undefined4)pRVar5->deviceMinor;
      local_d8._44_4_ = *(undefined4 *)((long)&pRVar5->deviceMinor + 4);
      pcVar1 = (pRVar5->pathname)._M_dataplus._M_p;
      local_a0._M_p = local_90;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_a0,pcVar1,pcVar1 + (pRVar5->pathname)._M_string_length);
      pcVar1 = (pRVar5->filename)._M_dataplus._M_p;
      local_80._M_p = local_70;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_80,pcVar1,pcVar1 + (pRVar5->filename)._M_string_length);
      iVar3 = std::__cxx11::string::compare((string *)&local_80);
      if (iVar3 == 0) {
        std::vector<remote::Region,_std::allocator<remote::Region>_>::push_back
                  (&local_f8,(value_type *)local_d8);
      }
      if (local_80._M_p != local_70) {
        operator_delete(local_80._M_p);
      }
      if (local_a0._M_p != local_90) {
        operator_delete(local_a0._M_p);
      }
      pRVar5 = pRVar5 + 1;
    } while (pRVar5 != local_48.super__Vector_base<remote::Region,_std::allocator<remote::Region>_>.
                       _M_impl.super__Vector_impl_data._M_finish);
    std::vector<remote::Region,_std::allocator<remote::Region>_>::vector(&local_60,&local_f8);
    Module::Module(__return_storage_ptr__,&local_60);
    std::vector<remote::Region,_std::allocator<remote::Region>_>::~vector(&local_60);
    if ((__return_storage_ptr__->regions).
        super__Vector_base<remote::Region,_std::allocator<remote::Region>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        (__return_storage_ptr__->regions).
        super__Vector_base<remote::Region,_std::allocator<remote::Region>_>._M_impl.
        super__Vector_impl_data._M_start) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Regions: ",9);
      *(uint *)(process_vm_readv + *(long *)(std::cout + -0x18)) =
           *(uint *)(process_vm_readv + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 8;
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Path: ",6);
      pRVar5 = (__return_storage_ptr__->regions).
               super__Vector_base<remote::Region,_std::allocator<remote::Region>_>._M_impl.
               super__Vector_impl_data._M_start;
      _Var2._M_p = (pRVar5->pathname)._M_dataplus._M_p;
      local_d8._0_8_ = local_d8 + 0x10;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_d8,_Var2._M_p,_Var2._M_p + (pRVar5->pathname)._M_string_length);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(char *)local_d8._0_8_,
                          CONCAT44(local_d8._12_4_,local_d8._8_4_));
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
      if ((undefined1 *)local_d8._0_8_ != local_d8 + 0x10) {
        operator_delete((void *)local_d8._0_8_);
      }
      Module::CacheSymbolData(__return_storage_ptr__);
    }
    std::vector<remote::Region,_std::allocator<remote::Region>_>::~vector(&local_f8);
  }
  std::vector<remote::Region,_std::allocator<remote::Region>_>::~vector(&local_48);
  return __return_storage_ptr__;
}

Assistant:

Module remote::GetModuleHandle(Handle proc, string filename) {
    vector<Region> processRegions = proc.GetRegions();

    if(processRegions.size() == 0) {
        return Module();
    }

    vector<Region> regs;

    for(auto reg : processRegions) {
        if(reg.filename.compare(filename) == 0) {
            regs.push_back(reg);
        }
    }

    Module ret = Module(regs);

    if(ret.IsValid()) {
        std::cout << "Regions: " << std::hex << ret.GetRegionCount() << std::endl;
        std::cout << "Path: " << ret.GetPath() << std::endl;

        ret.CacheSymbolData();
    }

    return ret;
}